

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void CreateBinaryTree(void)

{
  size_t __nmemb;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  vocab_word *pvVar3;
  FILE *__stream;
  long lVar4;
  longlong lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  longlong lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char code [40];
  longlong point [40];
  int8_t local_1a8 [48];
  long local_178 [41];
  
  lVar5 = vocab_size;
  lVar12 = vocab_size * 2;
  __nmemb = vocab_size * 2 + 1;
  __ptr = calloc(__nmemb,8);
  __ptr_00 = calloc(__nmemb,8);
  __ptr_01 = calloc(__nmemb,8);
  if (0 < lVar5) {
    lVar4 = 0;
    pvVar3 = vocab;
    do {
      *(longint *)((long)__ptr + lVar4 * 8) = pvVar3->cn;
      lVar4 = lVar4 + 1;
      pvVar3 = pvVar3 + 1;
    } while (lVar5 != lVar4);
  }
  auVar2 = _DAT_00106050;
  auVar1 = _DAT_00106040;
  if (SBORROW8(lVar5,lVar12) != 0 < lVar5) {
    lVar12 = lVar5 + -1;
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar7 = 0;
    auVar14 = auVar14 ^ _DAT_00106050;
    do {
      auVar15._8_4_ = (int)uVar7;
      auVar15._0_8_ = uVar7;
      auVar15._12_4_ = (int)(uVar7 >> 0x20);
      auVar15 = (auVar15 | auVar1) ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                  auVar14._4_4_ < auVar15._4_4_) & 1)) {
        *(undefined8 *)((long)__ptr + uVar7 * 8 + lVar5 * 8) = 1000000000000000;
      }
      if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
          auVar15._12_4_ <= auVar14._12_4_) {
        *(undefined8 *)((long)__ptr + uVar7 * 8 + lVar5 * 8 + 8) = 1000000000000000;
      }
      uVar7 = uVar7 + 2;
    } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar7);
  }
  if (1 < lVar5) {
    lVar4 = 0;
    lVar12 = lVar5 + -1;
    lVar10 = lVar5;
    do {
      if (lVar12 < 0) {
        lVar11 = lVar10 + 1;
LAB_00102dce:
        lVar9 = lVar11 + 1;
        lVar8 = lVar12;
      }
      else {
        lVar6 = *(long *)((long)__ptr + lVar12 * 8);
        lVar8 = *(long *)((long)__ptr + lVar10 * 8);
        if (lVar6 < lVar8) {
          if (lVar12 == 0) {
            lVar12 = -1;
            lVar11 = lVar10;
            lVar10 = 0;
            goto LAB_00102dce;
          }
          lVar6 = *(long *)((long)__ptr + lVar12 * 8 + -8);
          lVar11 = lVar12 + -1;
          lVar9 = lVar10;
          lVar10 = lVar12;
        }
        else {
          lVar8 = *(long *)((long)__ptr + lVar10 * 8 + 8);
          lVar9 = lVar10 + 1;
          lVar11 = lVar12;
        }
        lVar12 = lVar11;
        lVar11 = lVar9;
        if (lVar8 <= lVar6) goto LAB_00102dce;
        lVar8 = lVar12 + -1;
        lVar11 = lVar12;
      }
      *(long *)((long)__ptr + lVar4 * 8 + lVar5 * 8) =
           *(long *)((long)__ptr + lVar11 * 8) + *(long *)((long)__ptr + lVar10 * 8);
      *(longlong *)((long)__ptr_01 + lVar10 * 8) = lVar5 + lVar4;
      *(longlong *)((long)__ptr_01 + lVar11 * 8) = lVar5 + lVar4;
      *(undefined8 *)((long)__ptr_00 + lVar11 * 8) = 1;
      lVar4 = lVar4 + 1;
      lVar12 = lVar8;
      lVar10 = lVar9;
    } while (lVar5 + -1 != lVar4);
  }
  __stream = fopen(output_classifier,"wb");
  if (1 < vocab_size) {
    lVar12 = 0;
    do {
      if (binary == 0) {
        fprintf(__stream,"%lld %lld %lld\n",lVar12,*(undefined8 *)((long)__ptr_01 + lVar12 * 8));
      }
      else {
        local_178[0] = (*(long *)((long)__ptr_00 + lVar12 * 8) * 2 + -1) *
                       *(long *)((long)__ptr_01 + lVar12 * 8);
        fwrite(local_178,8,1,__stream);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < vocab_size * 2 + -2);
  }
  fclose(__stream);
  if (0 < vocab_size) {
    lVar12 = 0;
    lVar5 = vocab_size;
    do {
      pvVar3 = vocab;
      lVar11 = 0;
      lVar4 = lVar12;
      lVar8 = 1;
      do {
        lVar9 = lVar8;
        lVar6 = lVar11;
        local_1a8[lVar6] = *(int8_t *)((long)__ptr_00 + lVar4 * 8);
        local_178[lVar6] = lVar4;
        lVar4 = *(long *)((long)__ptr_01 + lVar4 * 8);
        lVar11 = lVar6 + 1;
        lVar8 = lVar9 + 1;
      } while (lVar4 != lVar5 * 2 + -2);
      vocab[lVar12].codelen = (int8_t)(lVar6 + 1);
      *pvVar3[lVar12].point = (int)lVar5 + -2;
      lVar4 = 0;
      do {
        pvVar3[lVar12].code[lVar9 + -1] = local_1a8[lVar4];
        pvVar3 = vocab;
        lVar5 = vocab_size;
        vocab[lVar12].point[lVar9] = (int)local_178[lVar4] - (int)vocab_size;
        lVar4 = lVar4 + 1;
        lVar9 = lVar9 + -1;
        bVar13 = lVar6 != 0;
        lVar6 = lVar6 + -1;
      } while (bVar13);
      lVar12 = lVar12 + 1;
    } while (lVar12 < lVar5);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void CreateBinaryTree() {
  long long a, b, i, min1i, min2i, pos1, pos2, point[MAX_CODE_LENGTH];
  char code[MAX_CODE_LENGTH];
  long long *count = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *binary_side = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  long long *parent_node = (long long *)calloc(vocab_size * 2 + 1, sizeof(long long));
  for (a = 0; a < vocab_size; a++) count[a] = vocab[a].cn;
  for (a = vocab_size; a < vocab_size * 2; a++) count[a] = 1e15;
  pos1 = vocab_size - 1;
  pos2 = vocab_size;
  // Following algorithm constructs the Huffman tree by adding one node at a time
  for (a = 0; a < vocab_size - 1; a++) {
    // First, find two smallest nodes 'min1, min2'
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min1i = pos1;
        pos1--;
      } else {
        min1i = pos2;
        pos2++;
      }
    } else {
      min1i = pos2;
      pos2++;
    }
    if (pos1 >= 0) {
      if (count[pos1] < count[pos2]) {
        min2i = pos1;
        pos1--;
      } else {
        min2i = pos2;
        pos2++;
      }
    } else {
      min2i = pos2;
      pos2++;
    }
    count[vocab_size + a] = count[min1i] + count[min2i];
    parent_node[min1i] = vocab_size + a;
    parent_node[min2i] = vocab_size + a;
    binary_side[min2i] = 1;
  }
  // Outputs the tree if requested
  if (output_classifier) {
    FILE * file = fopen(output_classifier, "wb");
    // The root is not written (node vocab_size * 2 - 2)
    for (b = 0; b < vocab_size * 2 - 2; b++) {
      if (binary) {
        // In binary mode, just write the parent * sign
        // where sign is +1 or -1, depending on which child is used
        longint d = (2 * binary_side[b] - 1) * parent_node[b];
        fwrite(&d, sizeof(longint), 1,  file);
      } else fprintf(file, "%lld %lld %lld\n", b, parent_node[b], binary_side[b]);
    }
    fclose(file);
  }

  // Now assign binary_side code to each vocabulary word
  for (a = 0; a < vocab_size; a++) {
    b = a;
    i = 0;
    while (1) {
      code[i] = binary_side[b];
      point[i] = b;
      i++;
      b = parent_node[b];
      if (b == vocab_size * 2 - 2) break;
    }
    vocab[a].codelen = i;
    vocab[a].point[0] = vocab_size - 2;
    for (b = 0; b < i; b++) {
      vocab[a].code[i - b - 1] = code[b];
      vocab[a].point[i - b] = point[b] - vocab_size;
    }
  }
  free(count);
  free(binary_side);
  free(parent_node);
}